

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.h
# Opt level: O1

bool __thiscall mjs::native_object::do_native_put(native_object *this,string *name,value *val)

{
  bool bVar1;
  uint *puVar2;
  native_object_property *pnVar3;
  wstring_view local_28;
  
  puVar2 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)name);
  local_28._M_len = (size_t)*puVar2;
  local_28._M_str = (wchar_t *)(puVar2 + 1);
  pnVar3 = find(this,&local_28);
  if (pnVar3 != (native_object_property *)0x0) {
    bVar1 = has_attributes(pnVar3->attributes,read_only);
    if (!bVar1) {
      (*pnVar3->put)(this,val);
    }
  }
  return pnVar3 != (native_object_property *)0x0;
}

Assistant:

bool do_native_put(const string& name, const value& val) {
        if (auto it = find(name.view())) {
            if (!has_attributes(it->attributes, property_attribute::read_only)) {
                it->put(*this, val);
            }
            return true;
        } else {
            return false;
        }
    }